

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall
tcu::x11::XlibWindow::XlibWindow
          (XlibWindow *this,XlibDisplay *display,int width,int height,Visual *visual)

{
  deBool dVar1;
  Display *pDVar2;
  VisualID visualID;
  InternalError *this_00;
  Colormap CVar3;
  Window WVar4;
  TestError *this_01;
  Atom local_118;
  Atom deleteAtom;
  undefined1 auStack_108 [7];
  bool succ;
  XVisualInfo info;
  undefined8 uStack_c0;
  bool overrideRedirect;
  unsigned_long mask;
  Window root;
  Display *dpy;
  XSetWindowAttributes swa;
  Visual *visual_local;
  int height_local;
  int width_local;
  XlibDisplay *display_local;
  XlibWindow *this_local;
  
  swa.cursor = (Cursor)visual;
  WindowBase::WindowBase(&this->super_WindowBase);
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XlibWindow_011b8c58;
  this->m_display = display;
  this->m_colormap = 0;
  this->m_window = 0;
  pDVar2 = XlibDisplay::getXDisplay(this->m_display);
  mask = *(unsigned_long *)(*(long *)(pDVar2 + 0xe8) + (long)*(int *)(pDVar2 + 0xe0) * 0x80 + 0x10);
  uStack_c0 = 0x808;
  info.bits_per_rgb._3_1_ = 0;
  if (swa.cursor == 0) {
    swa.cursor = 0;
  }
  else {
    info.green_mask = 0;
    info.blue_mask = 0;
    info.c_class = 0;
    info._28_4_ = 0;
    info.red_mask = 0;
    info.visualid = 0;
    info.screen = 0;
    info.depth = 0;
    _auStack_108 = (Visual *)0x0;
    info.visual = (Visual *)0x0;
    visualID = XVisualIDFromVisual(swa.cursor);
    deleteAtom._7_1_ = XlibDisplay::getVisualInfo(display,visualID,(XVisualInfo *)auStack_108);
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || ((deleteAtom._7_1_ & 1) == 0)) {
        this_00 = (InternalError *)__cxa_allocate_exception(0x38);
        InternalError::InternalError
                  (this_00,(char *)0x0,"succ",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
                   ,0xaf);
        __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    mask = *(unsigned_long *)(*(long *)(pDVar2 + 0xe8) + 0x10 + (long)(int)info.visualid * 0x80);
    CVar3 = XCreateColormap(pDVar2,mask,swa.cursor,0);
    this->m_colormap = CVar3;
    swa._88_8_ = this->m_colormap;
    uStack_c0 = 0x2808;
  }
  swa.border_pixmap = 0;
  swa.save_under = 0x28003;
  swa._68_4_ = 0;
  visual_local._4_4_ = width;
  if (width == -1) {
    visual_local._4_4_ = 400;
  }
  visual_local._0_4_ = height;
  if (height == -1) {
    visual_local._0_4_ = 300;
  }
  WVar4 = XCreateWindow(pDVar2,mask,0,0,visual_local._4_4_,(int)visual_local,0,0,1,swa.cursor,
                        uStack_c0,&dpy);
  this->m_window = WVar4;
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (this->m_window == 0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      local_118 = XlibDisplay::getDeleteAtom(this->m_display);
      XSetWMProtocols(pDVar2,this->m_window,&local_118,1);
      XSync(pDVar2,0);
      return;
    }
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_01,(char *)0x0,"m_window",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
             ,0xc1);
  __cxa_throw(this_01,&TestError::typeinfo,TestError::~TestError);
}

Assistant:

XlibWindow::XlibWindow (XlibDisplay& display, int width, int height, ::Visual* visual)
	: WindowBase	()
	, m_display		(display)
	, m_colormap	(None)
	, m_window		(None)
{
	XSetWindowAttributes	swa;
	::Display* const		dpy					= m_display.getXDisplay();
	::Window				root				= DefaultRootWindow(dpy);
	unsigned long			mask				= CWBorderPixel | CWEventMask;

	// If redirect is enabled, window size can't be guaranteed and it is up to
	// the window manager to decide whether to honor sizing requests. However,
	// overriding that causes window to appear as an overlay, which causes
	// other issues, so this is disabled by default.
	const bool				overrideRedirect	= false;

	if (overrideRedirect)
	{
		mask |= CWOverrideRedirect;
		swa.override_redirect = true;
	}

	if (visual == DE_NULL)
		visual = CopyFromParent;
	else
	{
		XVisualInfo	info	= XVisualInfo();
		bool		succ	= display.getVisualInfo(XVisualIDFromVisual(visual), info);

		TCU_CHECK_INTERNAL(succ);

		root				= RootWindow(dpy, info.screen);
		m_colormap			= XCreateColormap(dpy, root, visual, AllocNone);
		swa.colormap		= m_colormap;
		mask |= CWColormap;
	}

	swa.border_pixel	= 0;
	swa.event_mask		= ExposureMask|KeyPressMask|KeyReleaseMask|StructureNotifyMask;

	if (width == glu::RenderConfig::DONT_CARE)
		width = DEFAULT_WINDOW_WIDTH;
	if (height == glu::RenderConfig::DONT_CARE)
		height = DEFAULT_WINDOW_HEIGHT;

	m_window = XCreateWindow(dpy, root, 0, 0, width, height, 0,
							 CopyFromParent, InputOutput, visual, mask, &swa);
	TCU_CHECK(m_window);

	Atom deleteAtom = m_display.getDeleteAtom();
	XSetWMProtocols(dpy, m_window, &deleteAtom, 1);
	XSync(dpy,false);
}